

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

void convert_32s_P4C4(OPJ_INT32 **pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length,OPJ_INT32 adjust)

{
  OPJ_INT32 *pOVar1;
  OPJ_INT32 *pOVar2;
  OPJ_INT32 *pOVar3;
  OPJ_INT32 *pOVar4;
  OPJ_INT32 *pOVar5;
  OPJ_SIZE_T OVar6;
  
  if (length != 0) {
    pOVar1 = *pSrc;
    pOVar2 = pSrc[1];
    pOVar3 = pSrc[2];
    pOVar4 = pSrc[3];
    pOVar5 = pDst + 3;
    OVar6 = 0;
    do {
      pOVar5[-3] = pOVar1[OVar6] + adjust;
      pOVar5[-2] = pOVar2[OVar6] + adjust;
      pOVar5[-1] = pOVar3[OVar6] + adjust;
      *pOVar5 = pOVar4[OVar6] + adjust;
      OVar6 = OVar6 + 1;
      pOVar5 = pOVar5 + 4;
    } while (length != OVar6);
  }
  return;
}

Assistant:

static void convert_32s_P4C4(OPJ_INT32 const* const* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length, OPJ_INT32 adjust)
{
	OPJ_SIZE_T i;
	const OPJ_INT32* pSrc0 = pSrc[0];
	const OPJ_INT32* pSrc1 = pSrc[1];
	const OPJ_INT32* pSrc2 = pSrc[2];
	const OPJ_INT32* pSrc3 = pSrc[3];
	
	for (i = 0; i < length; i++) {
		pDst[4*i+0] = pSrc0[i] + adjust;
		pDst[4*i+1] = pSrc1[i] + adjust;
		pDst[4*i+2] = pSrc2[i] + adjust;
		pDst[4*i+3] = pSrc3[i] + adjust;
	}
}